

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * Catch::rangeToString<std::filesystem::__cxx11::directory_iterator>
                   (string *__return_storage_ptr__,directory_iterator *range)

{
  directory_iterator *in_RCX;
  directory_iterator local_58;
  directory_iterator local_48;
  directory_iterator local_38;
  directory_iterator local_28;
  directory_iterator *local_18;
  directory_iterator *range_local;
  
  local_18 = range;
  range_local = (directory_iterator *)__return_storage_ptr__;
  clara::std::filesystem::__cxx11::directory_iterator::directory_iterator(&local_38,range);
  clara::std::filesystem::__cxx11::begin((__cxx11 *)&local_28,&local_38);
  clara::std::filesystem::__cxx11::directory_iterator::directory_iterator(&local_58,local_18);
  clara::std::filesystem::__cxx11::end(&local_48);
  Detail::
  rangeToString<std::filesystem::__cxx11::directory_iterator,std::filesystem::__cxx11::directory_iterator>
            (__return_storage_ptr__,(Detail *)&local_28,&local_48,in_RCX);
  clara::std::filesystem::__cxx11::directory_iterator::~directory_iterator(&local_48);
  clara::std::filesystem::__cxx11::directory_iterator::~directory_iterator(&local_58);
  clara::std::filesystem::__cxx11::directory_iterator::~directory_iterator(&local_28);
  clara::std::filesystem::__cxx11::directory_iterator::~directory_iterator(&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string rangeToString( Range const& range ) {
        return ::Catch::Detail::rangeToString( begin( range ), end( range ) );
    }